

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int memdbUnfetch(sqlite3_file *pFile,sqlite3_int64 iOfst,void *pPage)

{
  sqlite3_io_methods *psVar1;
  sqlite3_mutex *psVar2;
  
  psVar1 = pFile[1].pMethods;
  if ((sqlite3_mutex *)psVar1->xTruncate == (sqlite3_mutex *)0x0) {
    psVar2 = (sqlite3_mutex *)0x0;
  }
  else {
    (*sqlite3Config.mutex.xMutexEnter)((sqlite3_mutex *)psVar1->xTruncate);
    psVar2 = (sqlite3_mutex *)psVar1->xTruncate;
  }
  *(int *)&psVar1->xSync = *(int *)&psVar1->xSync + -1;
  if (psVar2 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(psVar2);
  }
  return 0;
}

Assistant:

static int memdbUnfetch(sqlite3_file *pFile, sqlite3_int64 iOfst, void *pPage){
  MemStore *p = ((MemFile*)pFile)->pStore;
  UNUSED_PARAMETER(iOfst);
  UNUSED_PARAMETER(pPage);
  memdbEnter(p);
  p->nMmap--;
  memdbLeave(p);
  return SQLITE_OK;
}